

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_Basic_Test::TestBody
          (PhpGeneratorTest_Basic_Test *this)

{
  string_view name;
  string_view command;
  string_view contents;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    syntax = \"proto3\";\n    message Foo {\n      optional int32 bar = 1;\n      int32 baz = 2;\n    }"
  ;
  contents._M_len = 0x62;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  command._M_str = "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto";
  command._M_len = 0x42;
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,command);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, Basic) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto3";
    message Foo {
      optional int32 bar = 1;
      int32 baz = 2;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectNoErrors();
}